

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::EmitClosureRangeChecks(IRBuilder *this)

{
  code *pcVar1;
  Bucket<FrameDisplayCheckRecord_*> *this_00;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type_conflict node;
  Opnd *this_01;
  JITTimeFunctionBody *this_02;
  StackSym *pSVar6;
  JitArenaAllocator *pJVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  ByteCodeUsesInstr *this_03;
  ByteCodeUsesInstr *byteCodeUse;
  Instr *instr_1;
  Instr *instrStop;
  Instr *__nextInstrCheck;
  TrackAllocData local_d8;
  code *local_b0;
  undefined8 local_a8;
  TrackAllocData local_a0;
  BVSparse<Memory::JitArenaAllocator> *local_78;
  BVSparse<Memory::JitArenaAllocator> *bv;
  AddrOpnd *recordOpnd;
  Instr *instr;
  RegOpnd *dstOpnd;
  Instr *insertInstr;
  Instr *instrDef;
  StackSym *stackSym;
  Bucket<FrameDisplayCheckRecord_*> *bucket;
  Iterator __iter;
  uint _iterHash;
  IRBuilder *this_local;
  
  if (this->m_func->frameDisplayCheckTable != (FrameDisplayCheckTable *)0x0) {
    for (__iter.current._4_4_ = 0;
        __iter.current._4_4_ < this->m_func->frameDisplayCheckTable->tableSize;
        __iter.current._4_4_ = __iter.current._4_4_ + 1) {
      _bucket = SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>::
                GetIterator(this->m_func->frameDisplayCheckTable->table + __iter.current._4_4_);
      while( true ) {
        if (__iter.list ==
            (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        this_00 = bucket;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar2 = SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>::
                IsHead((SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>
                        *)this_00,node);
        if (bVar2) break;
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        stackSym = (StackSym *)
                   SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&bucket);
        instrDef = (Instr *)SymTable::FindStackSym
                                      (this->m_func->m_symTable,
                                       *(SymID *)&(stackSym->super_Sym).m_next);
        if ((instrDef == (Instr *)0x0) ||
           (((anon_union_8_2_fd66ddfd_for_StackSym_35 *)&instrDef->globOptInstrString)->m_instrDef
            == (Instr *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,899,"(stackSym && stackSym->m_instrDef)",
                             "stackSym && stackSym->m_instrDef");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        insertInstr = (Instr *)instrDef->globOptInstrString;
        dstOpnd = (RegOpnd *)insertInstr->m_next;
        this_01 = IR::Instr::UnlinkDst(insertInstr);
        instr = (Instr *)IR::Opnd::AsRegOpnd(this_01);
        recordOpnd = (AddrOpnd *)IR::Instr::New(FrameDisplayCheck,(Opnd *)instr,this->m_func);
        instr = (Instr *)IR::RegOpnd::New(TyVar,this->m_func);
        IR::Instr::SetDst(insertInstr,(Opnd *)instr);
        IR::Instr::SetSrc1((Instr *)recordOpnd,(Opnd *)instr);
        bv = (BVSparse<Memory::JitArenaAllocator> *)
             IR::AddrOpnd::New((stackSym->super_Sym)._vptr_Sym,AddrOpndKindDynamicMisc,this->m_func,
                               true,(Var)0x0);
        IR::Instr::SetSrc2((Instr *)recordOpnd,(Opnd *)bv);
        IR::Instr::InsertBefore((Instr *)dstOpnd,(Instr *)recordOpnd);
      }
    }
  }
  bVar2 = Func::IsLoopBody(this->m_func);
  if ((!bVar2) && (BVar3 = Func::HasTry(this->m_func), BVar3 != 0)) {
    this_02 = Func::GetJITFunctionBody(this->m_func);
    uVar4 = JITTimeFunctionBody::GetByteCodeInLoopCount(this_02);
    if (uVar4 != 0) {
      local_78 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      pSVar6 = Func::GetLocalClosureSym(this->m_func);
      if (pSVar6 != (StackSym *)0x0) {
        pSVar6 = Func::GetLocalClosureSym(this->m_func);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar6);
        if (bVar2) {
          pJVar7 = this->m_func->m_alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_a0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                     0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x39d);
          pJVar7 = (JitArenaAllocator *)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   *)pJVar7,&local_a0);
          local_b0 = Memory::JitArenaAllocator::Alloc;
          local_a8 = 0;
          pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
                   new<Memory::JitArenaAllocator>(0x20,pJVar7,0x4e98c0);
          BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar8,this->m_func->m_alloc);
          local_78 = pBVar8;
          pSVar6 = Func::GetLocalClosureSym(this->m_func);
          BVSparse<Memory::JitArenaAllocator>::Set(pBVar8,(pSVar6->super_Sym).m_id);
        }
      }
      pSVar6 = Func::GetLocalFrameDisplaySym(this->m_func);
      if (pSVar6 != (StackSym *)0x0) {
        pSVar6 = Func::GetLocalFrameDisplaySym(this->m_func);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar6);
        if (bVar2) {
          if (local_78 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
            pJVar7 = this->m_func->m_alloc;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_d8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3a4);
            pJVar7 = (JitArenaAllocator *)
                     Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                     *)pJVar7,&local_d8);
            pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
                     new<Memory::JitArenaAllocator>(0x20,pJVar7,0x4e98c0);
            BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar8,this->m_func->m_alloc);
            local_78 = pBVar8;
          }
          pBVar8 = local_78;
          pSVar6 = Func::GetLocalFrameDisplaySym(this->m_func);
          BVSparse<Memory::JitArenaAllocator>::Set(pBVar8,(pSVar6->super_Sym).m_id);
        }
      }
      if (local_78 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        instrStop = (Instr *)0x0;
        for (byteCodeUse = (ByteCodeUsesInstr *)this->m_func->m_tailInstr;
            byteCodeUse != (ByteCodeUsesInstr *)0x0;
            byteCodeUse = (ByteCodeUsesInstr *)(byteCodeUse->super_Instr).m_prev) {
          if ((instrStop != (Instr *)0x0) && ((ByteCodeUsesInstr *)instrStop->m_prev != byteCodeUse)
             ) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x3ab,
                               "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                               "Modifying instr list but not using EDITING iterator!");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          instrStop = &byteCodeUse->super_Instr;
          if ((byteCodeUse->super_Instr).m_opcode == Ret) {
            this_03 = IR::ByteCodeUsesInstr::New(&byteCodeUse->super_Instr);
            IR::ByteCodeUsesInstr::SetBV(this_03,local_78);
            IR::Instr::InsertBefore(&byteCodeUse->super_Instr,&this_03->super_Instr);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
IRBuilder::EmitClosureRangeChecks()
{
    if (m_func->frameDisplayCheckTable)
    {
        // Frame display checks. Again, chain to the instruction (LdEnv/LdSlot).
        FOREACH_HASHTABLE_ENTRY(FrameDisplayCheckRecord*, bucket, m_func->frameDisplayCheckTable)
        {
            StackSym *stackSym = m_func->m_symTable->FindStackSym(bucket.value);
            Assert(stackSym && stackSym->m_instrDef);

            IR::Instr *instrDef = stackSym->m_instrDef;
            IR::Instr *insertInstr = instrDef->m_next;
            IR::RegOpnd *dstOpnd = instrDef->UnlinkDst()->AsRegOpnd();
            IR::Instr *instr = IR::Instr::New(Js::OpCode::FrameDisplayCheck, dstOpnd, m_func);

            dstOpnd = IR::RegOpnd::New(TyVar, m_func);
            instrDef->SetDst(dstOpnd);
            instr->SetSrc1(dstOpnd);

            // Attach the two-dimensional check info.
            IR::AddrOpnd *recordOpnd = IR::AddrOpnd::New(bucket.element, IR::AddrOpndKindDynamicMisc, m_func, true);
            instr->SetSrc2(recordOpnd);

            insertInstr->InsertBefore(instr);
        }
        NEXT_HASHTABLE_ENTRY;
    }

    // If not a loop, but there are loops and trys, restore scope slot pointer and FD
    if (!m_func->IsLoopBody() && m_func->HasTry() && m_func->GetJITFunctionBody()->GetByteCodeInLoopCount() != 0)
    {
        BVSparse<JitArenaAllocator> * bv = nullptr;
        if (m_func->GetLocalClosureSym() && m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
        {
            bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            bv->Set(m_func->GetLocalClosureSym()->m_id);
        }
        if (m_func->GetLocalFrameDisplaySym() && m_func->GetLocalFrameDisplaySym()->HasByteCodeRegSlot())
        {
            if (!bv)
            {
                bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            }
            bv->Set(m_func->GetLocalFrameDisplaySym()->m_id);
        }
        if (bv)
        {

            FOREACH_INSTR_IN_FUNC_BACKWARD(instr, m_func)
            {
                if (instr->m_opcode == Js::OpCode::Ret)
                {
                    IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(instr);
                    byteCodeUse->SetBV(bv);
                    instr->InsertBefore(byteCodeUse);
                    break;
                }
            }
            NEXT_INSTR_IN_FUNC_BACKWARD;
        }
    }
}